

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * __thiscall Catch::Runner2::runTests(Totals *__return_storage_ptr__,Runner2 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Ptr<Catch::IReporter> *reporter;
  IReporter *pIVar2;
  pointer pcVar3;
  size_t sVar4;
  size_t sVar5;
  pointer filterGroup;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> filterGroups;
  Runner context;
  string local_238;
  TestCaseFilters *local_218;
  Runner2 *local_210;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> local_208;
  undefined1 local_1f0 [48];
  vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> local_1c0;
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [8];
  Config *local_118;
  size_t local_108;
  
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::vector
            (&local_208,&this->m_config->filters);
  if (local_208.super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_208.super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
    TestCaseFilters::TestCaseFilters((TestCaseFilters *)local_1f0,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
              (&local_208,(value_type *)local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_p != local_198) {
      operator_delete(local_1a8._M_p,local_198[0]._M_allocated_capacity + 1);
    }
    std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector(&local_1c0);
    std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector
              ((vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)
               (local_1f0 + 0x18));
    std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::~vector
              ((vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_> *)local_1f0);
  }
  reporter = &this->m_reporter;
  local_210 = this;
  Runner::Runner((Runner *)local_1f0,this->m_configWrapper,reporter);
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  local_218 = local_208.
              super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_208.super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_208.super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_238.field_2;
    filterGroup = local_208.
                  super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_108 == (long)(local_118->m_data).cutoff) break;
      pIVar2 = reporter->m_p;
      pcVar3 = (filterGroup->m_name)._M_dataplus._M_p;
      local_238._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,pcVar3,pcVar3 + (filterGroup->m_name)._M_string_length);
      (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[7])(pIVar2,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      runTestsForGroup((Totals *)&local_238,local_210,(Runner *)local_1f0,filterGroup);
      sVar4 = (__return_storage_ptr__->testCases).passed;
      sVar5 = (__return_storage_ptr__->testCases).failed;
      (__return_storage_ptr__->assertions).passed =
           (size_t)(local_238._M_dataplus._M_p + (__return_storage_ptr__->assertions).passed);
      (__return_storage_ptr__->assertions).failed =
           (__return_storage_ptr__->assertions).failed + local_238._M_string_length;
      (__return_storage_ptr__->testCases).passed = sVar4 + local_238.field_2._M_allocated_capacity;
      (__return_storage_ptr__->testCases).failed = sVar5 + local_238.field_2._8_8_;
      if (local_108 == (long)(local_118->m_data).cutoff) {
        (*(reporter->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])();
      }
      pIVar2 = reporter->m_p;
      pcVar3 = (filterGroup->m_name)._M_dataplus._M_p;
      local_238._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,pcVar3,pcVar3 + (filterGroup->m_name)._M_string_length);
      (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[8])
                (pIVar2,&local_238,__return_storage_ptr__);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      filterGroup = filterGroup + 1;
    } while (filterGroup != local_218);
  }
  Runner::~Runner((Runner *)local_1f0);
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::~vector(&local_208);
  return __return_storage_ptr__;
}

Assistant:

Totals runTests() {

            std::vector<TestCaseFilters> filterGroups = m_config.filters;
            if( filterGroups.empty() ) {
                TestCaseFilters filterGroup( "" );
                filterGroups.push_back( filterGroup );
            }

            Runner context( m_configWrapper, m_reporter ); // This Runner will be renamed Context
            Totals totals;

            std::vector<TestCaseFilters>::const_iterator it = filterGroups.begin();
            std::vector<TestCaseFilters>::const_iterator itEnd = filterGroups.end();
            for(; it != itEnd && !context.aborting(); ++it ) {
                m_reporter->StartGroup( it->getName() );
                totals += runTestsForGroup( context, *it );
                if( context.aborting() )
                    m_reporter->Aborted();
                m_reporter->EndGroup( it->getName(), totals );
            }
            return totals;
        }